

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O3

int EVP_PKEY_assign(EVP_PKEY *pkey,int type,void *key)

{
  int iVar1;
  
  if (type < 0x74) {
    if (type == 6) {
      iVar1 = EVP_PKEY_assign_RSA((EVP_PKEY *)pkey,(RSA *)key);
      return iVar1;
    }
    if (type == 0x1c) {
      iVar1 = EVP_PKEY_assign_DH((EVP_PKEY *)pkey,(DH *)key);
      return iVar1;
    }
  }
  else {
    if (type == 0x74) {
      iVar1 = EVP_PKEY_assign_DSA((EVP_PKEY *)pkey,(DSA *)key);
      return iVar1;
    }
    if (type == 0x198) {
      iVar1 = EVP_PKEY_assign_EC_KEY((EVP_PKEY *)pkey,(EC_KEY *)key);
      return iVar1;
    }
  }
  ERR_put_error(6,0,0x80,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                ,0xcf);
  ERR_add_error_dataf("algorithm %d",type);
  return 0;
}

Assistant:

int EVP_PKEY_assign(EVP_PKEY *pkey, int type, void *key) {
  // This function can only be used to assign RSA, DSA, EC, and DH keys. Other
  // key types have internal representations which are not exposed through the
  // public API.
  switch (type) {
    case EVP_PKEY_RSA:
      return EVP_PKEY_assign_RSA(pkey, reinterpret_cast<RSA *>(key));
    case EVP_PKEY_DSA:
      return EVP_PKEY_assign_DSA(pkey, reinterpret_cast<DSA *>(key));
    case EVP_PKEY_EC:
      return EVP_PKEY_assign_EC_KEY(pkey, reinterpret_cast<EC_KEY *>(key));
    case EVP_PKEY_DH:
      return EVP_PKEY_assign_DH(pkey, reinterpret_cast<DH *>(key));
  }

  OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
  ERR_add_error_dataf("algorithm %d", type);
  return 0;
}